

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::AbandonTransaction(CWallet *this,uint256 *hashTx)

{
  bool bVar1;
  int iVar2;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  CWalletTx *origtx;
  anon_class_1_0_00000001 try_updating_state;
  iterator it;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  CWalletTx *in_stack_ffffffffffffff38;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  CWalletTx *in_stack_ffffffffffffff58;
  TryUpdatingStateFn *try_updating_state_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff64;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  bool local_51;
  TryUpdatingStateFn local_50;
  undefined1 local_29;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_28;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70
             ,(char *)in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff58 >> 0x18,0));
  local_20._M_cur =
       (__node_type *)
       _GLOBAL__N_1::std::
       unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
       ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
               *)in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
  local_28._M_cur =
       (__node_type *)
       _GLOBAL__N_1::std::
       unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
       ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
              *)in_stack_ffffffffffffff40);
  bVar1 = _GLOBAL__N_1::std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                     (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     in_stack_ffffffffffffff40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("it != mapWallet.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x523,"bool wallet::CWallet::AbandonTransaction(const uint256 &)");
  }
  _GLOBAL__N_1::std::__detail::
  _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator->
            ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
             in_stack_ffffffffffffff38);
  iVar2 = GetTxDepthInMainChain
                    ((CWallet *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
  if (iVar2 == 0) {
    bVar1 = CWalletTx::InMempool(in_stack_ffffffffffffff38);
    uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff60);
    if (!bVar1) {
      local_29 = 0;
      try_updating_state_00 = &local_50;
      std::function<wallet::CWallet::TxUpdate(wallet::CWalletTx&)>::
      function<wallet::CWallet::AbandonTransaction(uint256_const&)::__0&,void>
                ((function<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&)> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40);
      RecursiveUpdateTxState(in_RDI,(uint256 *)CONCAT44(iVar2,uVar3),try_updating_state_00);
      std::function<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&)>::~function
                ((function<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&)> *)
                 in_stack_ffffffffffffff38);
      local_51 = true;
      goto LAB_00add25e;
    }
  }
  local_51 = false;
LAB_00add25e:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_51;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::AbandonTransaction(const uint256& hashTx)
{
    LOCK(cs_wallet);

    // Can't mark abandoned if confirmed or in mempool
    auto it = mapWallet.find(hashTx);
    assert(it != mapWallet.end());
    const CWalletTx& origtx = it->second;
    if (GetTxDepthInMainChain(origtx) != 0 || origtx.InMempool()) {
        return false;
    }

    auto try_updating_state = [](CWalletTx& wtx) EXCLUSIVE_LOCKS_REQUIRED(cs_wallet) {
        // If the orig tx was not in block/mempool, none of its spends can be.
        assert(!wtx.isConfirmed());
        assert(!wtx.InMempool());
        // If already conflicted or abandoned, no need to set abandoned
        if (!wtx.isBlockConflicted() && !wtx.isAbandoned()) {
            wtx.m_state = TxStateInactive{/*abandoned=*/true};
            return TxUpdate::NOTIFY_CHANGED;
        }
        return TxUpdate::UNCHANGED;
    }